

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

void __thiscall ED::ComputeAnchorPoints(ED *this)

{
  size_type sVar1;
  Point_<int> local_40;
  int local_38;
  int local_34;
  int diff2_1;
  int diff1_1;
  int local_28;
  int local_24;
  int diff2;
  int diff1;
  int j;
  int inc;
  int start;
  int i;
  ED *this_local;
  
  _start = this;
  for (inc = 2; inc < this->height + -2; inc = inc + 1) {
    j = 2;
    diff1 = 1;
    if (inc % this->scanInterval != 0) {
      j = this->scanInterval;
      diff1 = this->scanInterval;
    }
    for (diff2 = j; diff2 < this->width + -2; diff2 = diff1 + diff2) {
      if (this->gradThresh <= (int)this->gradImg[inc * this->width + diff2]) {
        if (this->dirImg[inc * this->width + diff2] == '\x01') {
          local_24 = (int)this->gradImg[inc * this->width + diff2] -
                     (int)this->gradImg[inc * this->width + diff2 + -1];
          local_28 = (int)this->gradImg[inc * this->width + diff2] -
                     (int)this->gradImg[inc * this->width + diff2 + 1];
          if ((this->anchorThresh <= local_24) && (this->anchorThresh <= local_28)) {
            this->edgeImg[inc * this->width + diff2] = 0xfe;
            cv::Point_<int>::Point_((Point_<int> *)&diff2_1,diff2,inc);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                      (&this->anchorPoints,(value_type *)&diff2_1);
          }
        }
        else {
          local_34 = (int)this->gradImg[inc * this->width + diff2] -
                     (int)this->gradImg[(inc + -1) * this->width + diff2];
          local_38 = (int)this->gradImg[inc * this->width + diff2] -
                     (int)this->gradImg[(inc + 1) * this->width + diff2];
          if ((this->anchorThresh <= local_34) && (this->anchorThresh <= local_38)) {
            this->edgeImg[inc * this->width + diff2] = 0xfe;
            cv::Point_<int>::Point_(&local_40,diff2,inc);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                      (&this->anchorPoints,&local_40);
          }
        }
      }
    }
  }
  sVar1 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(&this->anchorPoints)
  ;
  this->anchorNos = (int)sVar1;
  return;
}

Assistant:

void ED::ComputeAnchorPoints()
{
	//memset(edgeImg, 0, width*height);
	for (int i = 2; i<height - 2; i++) {
		int start = 2;
		int inc = 1;
		if (i%scanInterval != 0) { start = scanInterval; inc = scanInterval; }

		for (int j = start; j<width - 2; j += inc) {
			if (gradImg[i*width + j] < gradThresh) continue;

			if (dirImg[i*width + j] == EDGE_VERTICAL) {
				// vertical edge
				int diff1 = gradImg[i*width + j] - gradImg[i*width + j - 1];
				int diff2 = gradImg[i*width + j] - gradImg[i*width + j + 1];
				if (diff1 >= anchorThresh && diff2 >= anchorThresh) {
					edgeImg[i*width + j] = ANCHOR_PIXEL;
					anchorPoints.push_back(Point(j, i)); 
				}

			}
			else {
				// horizontal edge
				int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j];
				int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j];
				if (diff1 >= anchorThresh && diff2 >= anchorThresh) {
					edgeImg[i*width + j] = ANCHOR_PIXEL;
					anchorPoints.push_back(Point(j, i)); 
				}
			} // end-else
		} //end-for-inner
	} //end-for-outer

	anchorNos = (int)anchorPoints.size(); // get the total number of anchor points
}